

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.h
# Opt level: O2

void __thiscall
slang::ast::CoverageBinSymbol::TransRangeList::visitExprs<no_legacy_generate::MainVisitor&>
          (TransRangeList *this,AlwaysFFVisitor *visitor)

{
  pointer ppEVar1;
  size_t sVar2;
  long lVar3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  
  ppEVar1 = (this->items)._M_ptr;
  sVar2 = (this->items)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    Expression::visit<no_legacy_generate::MainVisitor&>
              (*(Expression **)((long)ppEVar1 + lVar3),visitor);
  }
  if (this->repeatFrom != (Expression *)0x0) {
    Expression::visit<no_legacy_generate::MainVisitor&>(this->repeatFrom,visitor);
  }
  if (this->repeatTo != (Expression *)0x0) {
    Expression::visit<no_legacy_generate::MainVisitor&>(this->repeatTo,visitor);
    return;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
            for (auto item : items)
                item->visit(visitor);

            if (repeatFrom)
                repeatFrom->visit(visitor);

            if (repeatTo)
                repeatTo->visit(visitor);
        }